

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

void __thiscall FPolyObj::ClearSubsectorLinks(FPolyObj *this)

{
  FPolyNode *pFVar1;
  FPolyNode *this_00;
  FPolyNode *next;
  FPolyObj *this_local;
  
  while( true ) {
    if (this->subsectorlinks == (FPolyNode *)0x0) {
      this->subsectorlinks = (FPolyNode *)0x0;
      return;
    }
    if (this->subsectorlinks->state != 0x539) break;
    pFVar1 = this->subsectorlinks->snext;
    if (this->subsectorlinks->pnext != (FPolyNode *)0x0) {
      if (this->subsectorlinks->pnext->state != 0x539) {
        __assert_fail("subsectorlinks->pnext->state == 1337",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                      ,0x71c,"void FPolyObj::ClearSubsectorLinks()");
      }
      this->subsectorlinks->pnext->pprev = this->subsectorlinks->pprev;
    }
    if (this->subsectorlinks->pprev == (FPolyNode *)0x0) {
      this->subsectorlinks->subsector->polys = this->subsectorlinks->pnext;
    }
    else {
      if (this->subsectorlinks->pprev->state != 0x539) {
        __assert_fail("subsectorlinks->pprev->state == 1337",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                      ,0x722,"void FPolyObj::ClearSubsectorLinks()");
      }
      this->subsectorlinks->pprev->pnext = this->subsectorlinks->pnext;
    }
    if (this->subsectorlinks->subsector->BSP != (FMiniBSP *)0x0) {
      this->subsectorlinks->subsector->BSP->bDirty = true;
    }
    this->subsectorlinks->state = -1;
    this_00 = this->subsectorlinks;
    if (this_00 != (FPolyNode *)0x0) {
      FPolyNode::~FPolyNode(this_00);
      operator_delete(this_00,0x40);
    }
    this->subsectorlinks = pFVar1;
  }
  __assert_fail("subsectorlinks->state == 1337",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                ,0x716,"void FPolyObj::ClearSubsectorLinks()");
}

Assistant:

void FPolyObj::ClearSubsectorLinks()
{
	while (subsectorlinks != NULL)
	{
		assert(subsectorlinks->state == 1337);

		FPolyNode *next = subsectorlinks->snext;

		if (subsectorlinks->pnext != NULL)
		{
			assert(subsectorlinks->pnext->state == 1337);
			subsectorlinks->pnext->pprev = subsectorlinks->pprev;
		}

		if (subsectorlinks->pprev != NULL)
		{
			assert(subsectorlinks->pprev->state == 1337);
			subsectorlinks->pprev->pnext = subsectorlinks->pnext;
		}
		else
		{
			subsectorlinks->subsector->polys = subsectorlinks->pnext;
		}

		if (subsectorlinks->subsector->BSP != NULL)
		{
			subsectorlinks->subsector->BSP->bDirty = true;
		}

		subsectorlinks->state = -1;
		delete subsectorlinks;
		subsectorlinks = next;
	}
	subsectorlinks = NULL;
}